

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

TFileStream * PartStream_Open(TCHAR *szFileName,DWORD dwStreamFlags)

{
  bool bVar1;
  TBlockStream *pStream_00;
  TBlockStream *pStream;
  DWORD dwStreamFlags_local;
  TCHAR *szFileName_local;
  
  pStream_00 = (TBlockStream *)AllocateFileStream(szFileName,0x100,dwStreamFlags);
  if (pStream_00 == (TBlockStream *)0x0) {
    return (TFileStream *)0x0;
  }
  if ((pStream_00->super_TFileStream).pMaster == (TFileStream *)0x0) {
    bVar1 = (*(pStream_00->super_TFileStream).BaseOpen)
                      ((TFileStream *)pStream_00,(pStream_00->super_TFileStream).szFileName,
                       dwStreamFlags);
    if (!bVar1) {
      FileStream_Close((TFileStream *)pStream_00);
      return (TFileStream *)0x0;
    }
    bVar1 = PartStream_LoadBitmap(pStream_00);
    if (!bVar1) {
      FileStream_Close((TFileStream *)pStream_00);
      SetLastError(1000);
      return (TFileStream *)0x0;
    }
  }
  else {
    bVar1 = PartStream_CreateMirror(pStream_00);
    if (!bVar1) {
      FileStream_Close((TFileStream *)pStream_00);
      SetLastError(2);
      return (TFileStream *)0x0;
    }
  }
  if ((pStream_00->super_TFileStream).StreamSize != 0) {
    (pStream_00->super_TFileStream).StreamPos = 0;
    (pStream_00->super_TFileStream).dwFlags = (pStream_00->super_TFileStream).dwFlags | 0x100;
    (pStream_00->super_TFileStream).StreamRead = BlockStream_Read;
    (pStream_00->super_TFileStream).StreamGetPos = BlockStream_GetPos;
    (pStream_00->super_TFileStream).StreamGetSize = BlockStream_GetSize;
    (pStream_00->super_TFileStream).StreamClose = PartStream_Close;
    (pStream_00->super_TFileStream).BlockCheck = PartStream_BlockCheck;
    (pStream_00->super_TFileStream).BlockRead = PartStream_BlockRead;
    return &pStream_00->super_TFileStream;
  }
  __assert_fail("pStream->StreamSize != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                ,0x715,"TFileStream *PartStream_Open(const TCHAR *, DWORD)");
}

Assistant:

static TFileStream * PartStream_Open(const TCHAR * szFileName, DWORD dwStreamFlags)
{
    TBlockStream * pStream;

    // Create new empty stream
    pStream = (TBlockStream *)AllocateFileStream(szFileName, sizeof(TBlockStream), dwStreamFlags);
    if(pStream == NULL)
        return NULL;

    // Do we have a master stream?
    if(pStream->pMaster != NULL)
    {
        if(!PartStream_CreateMirror(pStream))
        {
            FileStream_Close(pStream);
            SetLastError(ERROR_FILE_NOT_FOUND);
            return NULL;
        }
    }
    else
    {
        // Attempt to open the base stream
        if(!pStream->BaseOpen(pStream, pStream->szFileName, dwStreamFlags))
        {
            FileStream_Close(pStream);
            return NULL;
        }

        // Load the part stream block map
        if(!PartStream_LoadBitmap(pStream))
        {
            FileStream_Close(pStream);
            SetLastError(ERROR_BAD_FORMAT);
            return NULL;
        }
    }

    // Set the stream position to zero. Stream size is already set
    assert(pStream->StreamSize != 0);
    pStream->StreamPos = 0;
    pStream->dwFlags |= STREAM_FLAG_READ_ONLY;

    // Set new function pointers
    pStream->StreamRead    = (STREAM_READ)BlockStream_Read;
    pStream->StreamGetPos  = BlockStream_GetPos;
    pStream->StreamGetSize = BlockStream_GetSize;
    pStream->StreamClose   = (STREAM_CLOSE)PartStream_Close;

    // Supply the block functions
    pStream->BlockCheck    = (BLOCK_CHECK)PartStream_BlockCheck;
    pStream->BlockRead     = (BLOCK_READ)PartStream_BlockRead;
    return pStream;
}